

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcowptr.h
# Opt level: O2

ssize_t __thiscall
vcow_ptr<VRle::Data>::write(vcow_ptr<VRle::Data> *this,int __fd,void *__buf,size_t __n)

{
  vcow_ptr<VRle::Data> vStack_18;
  
  if ((this->mModel->mRef).super___atomic_base<unsigned_long>._M_i != 1) {
    vcow_ptr<VRle::Data_const&>(&vStack_18,&this->mModel->mValue);
    operator=(this,&vStack_18);
    ~vcow_ptr(&vStack_18);
  }
  return (ssize_t)&this->mModel->mValue;
}

Assistant:

auto write() -> element_type&
    {
        if (!unique()) *this = vcow_ptr(read());

        return mModel->mValue;
    }